

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinterinfo.cpp
# Opt level: O2

QList<QPrinter::ColorMode> * __thiscall
QPrinterInfo::supportedColorModes
          (QList<QPrinter::ColorMode> *__return_storage_ptr__,QPrinterInfo *this)

{
  QPrintDevice *this_00;
  ColorMode *pCVar1;
  QList<QPrint::ColorMode> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QPrint::ColorMode> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &((this->d_ptr).d)->m_printDevice;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (ColorMode *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (ColorMode *)0xaaaaaaaaaaaaaaaa;
  QPrintDevice::supportedColorModes((QList<QPrint::ColorMode> *)&local_48,this_00);
  QList<QPrinter::ColorMode>::reserve(__return_storage_ptr__,local_48.size);
  pCVar1 = local_48.ptr;
  lVar3 = local_48.size << 2;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 4) {
    QList<QPrinter::ColorMode>::append
              (__return_storage_ptr__,*(parameter_type *)((long)pCVar1 + lVar2));
  }
  QArrayDataPointer<QPrint::ColorMode>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPrinter::ColorMode> QPrinterInfo::supportedColorModes() const
{
    Q_D(const QPrinterInfo);
    QList<QPrinter::ColorMode> list;
    const auto supportedColorModes = d->m_printDevice.supportedColorModes();
    list.reserve(supportedColorModes.size());
    for (QPrint::ColorMode mode : supportedColorModes)
        list << QPrinter::ColorMode(mode);
    return list;
}